

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O0

int lookup(uint32_t addr,uint32_t val)

{
  rnndecaddrinfo *a;
  char *__ptr;
  char *res;
  rnndecaddrinfo *info;
  uint32_t val_local;
  uint32_t addr_local;
  
  a = rnndec_decodeaddr(rnnctx,rnndom,(ulong)addr,0);
  if (a == (rnndecaddrinfo *)0x0) {
    val_local = 1;
  }
  else {
    if (a->typeinfo == (rnntypeinfo *)0x0) {
      printf("%s\n",a->name);
    }
    else {
      __ptr = rnndec_decodeval(rnnctx,a->typeinfo,(ulong)val,a->width);
      printf("%s => %s\n",a->name,__ptr);
      free(__ptr);
    }
    rnndec_free_decaddrinfo(a);
    val_local = 0;
  }
  return val_local;
}

Assistant:

static int
lookup(uint32_t addr, uint32_t val)
{
	struct rnndecaddrinfo *info;

	info = rnndec_decodeaddr(rnnctx, rnndom, addr, 0);
	if (!info)
		return 1;

	if (info->typeinfo) {
		char *res = rnndec_decodeval(rnnctx, info->typeinfo,
					     val, info->width);
		printf("%s => %s\n", info->name, res);
		free(res);
	} else {
		printf("%s\n", info->name);
	}
	rnndec_free_decaddrinfo(info);
	return 0;
}